

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_stream_test.c
# Opt level: O2

void test_tcp_dialer_loc_addr(void)

{
  nng_err nVar1;
  int iVar2;
  nng_err num;
  uint32_t uVar3;
  char *pcVar4;
  char *pcVar5;
  undefined1 local_c0 [8];
  nng_sockaddr sa;
  nng_stream_dialer *d;
  
  nVar1 = nng_stream_dialer_alloc
                    ((nng_stream_dialer **)(sa.s_storage.sa_pad + 0xf),"tcp://127.0.0.1:80");
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0x1b5,"%s: expected success, got %s (%d)",
                         "nng_stream_dialer_alloc(&d, \"tcp://127.0.0.1:80\")",pcVar4,nVar1);
  if (iVar2 != 0) {
    nVar1 = nng_stream_dialer_get_addr
                      ((nng_stream_dialer *)sa.s_storage.sa_pad[0xf],"local-address",
                       (nng_sockaddr *)local_c0);
    pcVar4 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                           ,0x1b6,"%s: expected success, got %s (%d)",
                           "nng_stream_dialer_get_addr(d, NNG_OPT_LOCADDR, &sa)",pcVar4,nVar1);
    if (iVar2 != 0) {
      acutest_check_((uint)(local_c0._0_2_ == 0),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                     ,0x1b7,"%s","sa.s_family == NNG_AF_UNSPEC");
      local_c0._0_2_ = 3;
      local_c0._2_2_ = 0x1f90;
      num = nng_stream_dialer_set_addr
                      ((nng_stream_dialer *)sa.s_storage.sa_pad[0xf],"local-address",
                       (nng_sockaddr *)local_c0);
      pcVar4 = nng_strerror(NNG_EADDRINVAL);
      acutest_check_((uint)(num == NNG_EADDRINVAL),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                     ,0x1bd,"%s fails with %s","nng_stream_dialer_set_addr(d, NNG_OPT_LOCADDR, &sa)"
                     ,pcVar4,nVar1);
      pcVar4 = nng_strerror(NNG_EADDRINVAL);
      pcVar5 = nng_strerror(num);
      acutest_message_("%s: expected %s (%d), got %s (%d)",
                       "nng_stream_dialer_set_addr(d, NNG_OPT_LOCADDR, &sa)",pcVar4,0xf,pcVar5,
                       (ulong)num);
      local_c0._0_2_ = 4;
      local_c0._2_2_ = 0x1f90;
      nVar1 = nng_stream_dialer_set_addr
                        ((nng_stream_dialer *)sa.s_storage.sa_pad[0xf],"local-address",
                         (nng_sockaddr *)local_c0);
      pcVar4 = nng_strerror(NNG_EADDRINVAL);
      acutest_check_((uint)(nVar1 == NNG_EADDRINVAL),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                     ,0x1c4,"%s fails with %s","nng_stream_dialer_set_addr(d, NNG_OPT_LOCADDR, &sa)"
                     ,pcVar4);
      pcVar4 = nng_strerror(NNG_EADDRINVAL);
      pcVar5 = nng_strerror(nVar1);
      acutest_message_("%s: expected %s (%d), got %s (%d)",
                       "nng_stream_dialer_set_addr(d, NNG_OPT_LOCADDR, &sa)",pcVar4,0xf,pcVar5,
                       (ulong)nVar1);
      local_c0._0_2_ = 1;
      local_c0._2_2_ = 0x756a;
      local_c0._4_2_ = 0x6b6e;
      local_c0[6] = '\0';
      nVar1 = nng_stream_dialer_set_addr
                        ((nng_stream_dialer *)sa.s_storage.sa_pad[0xf],"local-address",
                         (nng_sockaddr *)local_c0);
      pcVar4 = nng_strerror(NNG_EADDRINVAL);
      acutest_check_((uint)(nVar1 == NNG_EADDRINVAL),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                     ,0x1cb,"%s fails with %s","nng_stream_dialer_set_addr(d, NNG_OPT_LOCADDR, &sa)"
                     ,pcVar4);
      pcVar4 = nng_strerror(NNG_EADDRINVAL);
      pcVar5 = nng_strerror(nVar1);
      acutest_message_("%s: expected %s (%d), got %s (%d)",
                       "nng_stream_dialer_set_addr(d, NNG_OPT_LOCADDR, &sa)",pcVar4,0xf,pcVar5,
                       (ulong)nVar1);
      nVar1 = nng_stream_dialer_set_int
                        ((nng_stream_dialer *)sa.s_storage.sa_pad[0xf],"local-address",0x2a);
      pcVar4 = nng_strerror(NNG_EBADTYPE);
      acutest_check_((uint)(nVar1 == NNG_EBADTYPE),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                     ,0x1cf,"%s fails with %s","nng_stream_dialer_set_int(d, NNG_OPT_LOCADDR, 42)",
                     pcVar4);
      pcVar4 = nng_strerror(NNG_EBADTYPE);
      pcVar5 = nng_strerror(nVar1);
      acutest_message_("%s: expected %s (%d), got %s (%d)",
                       "nng_stream_dialer_set_int(d, NNG_OPT_LOCADDR, 42)",pcVar4,0x1e,pcVar5,
                       (ulong)nVar1);
      local_c0._0_2_ = 3;
      local_c0._2_2_ = 0;
      uVar3 = nuts_be32(0x7f000001);
      local_c0._4_2_ = (undefined2)uVar3;
      local_c0[6] = (undefined1)(uVar3 >> 0x10);
      local_c0[7] = (undefined1)(uVar3 >> 0x18);
      nVar1 = nng_stream_dialer_set_addr
                        ((nng_stream_dialer *)sa.s_storage.sa_pad[0xf],"local-address",
                         (nng_sockaddr *)local_c0);
      pcVar4 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                             ,0x1d5,"%s: expected success, got %s (%d)",
                             "nng_stream_dialer_set_addr(d, NNG_OPT_LOCADDR, &sa)",pcVar4,nVar1);
      if (iVar2 != 0) {
        nng_stream_dialer_free((nng_stream_dialer *)sa.s_storage.sa_pad[0xf]);
        return;
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
test_tcp_dialer_loc_addr(void)
{
	nng_stream_dialer *d;
	nng_sockaddr       sa;
	NUTS_PASS(nng_stream_dialer_alloc(&d, "tcp://127.0.0.1:80"));
	NUTS_PASS(nng_stream_dialer_get_addr(d, NNG_OPT_LOCADDR, &sa));
	NUTS_TRUE(sa.s_family == NNG_AF_UNSPEC);

	// cannot set a local port
	sa.s_in.sa_family = NNG_AF_INET;
	sa.s_in.sa_port   = 8080;
	NUTS_FAIL(nng_stream_dialer_set_addr(d, NNG_OPT_LOCADDR, &sa),
	    NNG_EADDRINVAL);

#ifdef NNG_HAVE_INET6
	// cannot set a local port
	sa.s_in6.sa_family = NNG_AF_INET6;
	sa.s_in6.sa_port   = 8080;
	NUTS_FAIL(nng_stream_dialer_set_addr(d, NNG_OPT_LOCADDR, &sa),
	    NNG_EADDRINVAL);
#endif

	// cannot set it to a bogus family
	sa.s_inproc.sa_family = NNG_AF_INPROC;
	snprintf(sa.s_inproc.sa_name, sizeof(sa.s_inproc.sa_name), "junk");
	NUTS_FAIL(nng_stream_dialer_set_addr(d, NNG_OPT_LOCADDR, &sa),
	    NNG_EADDRINVAL);

	// bad type test
	NUTS_FAIL(
	    nng_stream_dialer_set_int(d, NNG_OPT_LOCADDR, 42), NNG_EBADTYPE);

	// but we can set it to a legal value
	sa.s_in.sa_family = NNG_AF_INET;
	sa.s_in.sa_port   = 0;
	sa.s_in.sa_addr   = nuts_be32(0x7F000001);
	NUTS_PASS(nng_stream_dialer_set_addr(d, NNG_OPT_LOCADDR, &sa));

	nng_stream_dialer_free(d);
}